

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3GenerateIndexKey
              (Parse *pParse,Index *pIdx,int iDataCur,int regOut,int prefixOnly,int *piPartIdxLabel,
              Index *pPrior,int regPrior)

{
  ushort uVar1;
  Vdbe *v_00;
  int iVar2;
  char *zP4;
  uint local_54;
  char *zAff;
  int nCol;
  int regBase;
  int j;
  Vdbe *v;
  int *piPartIdxLabel_local;
  int prefixOnly_local;
  int regOut_local;
  int iDataCur_local;
  Index *pIdx_local;
  Parse *pParse_local;
  
  v_00 = pParse->pVdbe;
  if (piPartIdxLabel != (int *)0x0) {
    if (pIdx->pPartIdxWhere == (Expr *)0x0) {
      *piPartIdxLabel = 0;
    }
    else {
      iVar2 = sqlite3VdbeMakeLabel(v_00);
      *piPartIdxLabel = iVar2;
      pParse->iSelfTab = iDataCur + 1;
      sqlite3ExprCachePush(pParse);
      sqlite3ExprIfFalseDup(pParse,pIdx->pPartIdxWhere,*piPartIdxLabel,0x10);
      pParse->iSelfTab = 0;
    }
  }
  if ((prefixOnly == 0) || (((byte)pIdx->field_0x63 >> 3 & 1) == 0)) {
    uVar1 = pIdx->nColumn;
  }
  else {
    uVar1 = pIdx->nKeyCol;
  }
  local_54 = (uint)uVar1;
  iVar2 = sqlite3GetTempRange(pParse,local_54);
  if ((pPrior != (Index *)0x0) && ((iVar2 != regPrior || (pPrior->pPartIdxWhere != (Expr *)0x0)))) {
    pPrior = (Index *)0x0;
  }
  for (nCol = 0; nCol < (int)local_54; nCol = nCol + 1) {
    if (((pPrior == (Index *)0x0) || (pPrior->aiColumn[nCol] != pIdx->aiColumn[nCol])) ||
       (pPrior->aiColumn[nCol] == -2)) {
      sqlite3ExprCodeLoadIndexColumn(pParse,pIdx,iDataCur,nCol,iVar2 + nCol);
      sqlite3VdbeDeletePriorOpcode(v_00,'H');
    }
  }
  if ((regOut != 0) &&
     (sqlite3VdbeAddOp3(v_00,99,iVar2,local_54,regOut), pIdx->pTable->pSelect != (Select *)0x0)) {
    zP4 = sqlite3IndexAffinityStr(pParse->db,pIdx);
    sqlite3VdbeChangeP4(v_00,-1,zP4,0);
  }
  sqlite3ReleaseTempRange(pParse,iVar2,local_54);
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3GenerateIndexKey(
  Parse *pParse,       /* Parsing context */
  Index *pIdx,         /* The index for which to generate a key */
  int iDataCur,        /* Cursor number from which to take column data */
  int regOut,          /* Put the new key into this register if not 0 */
  int prefixOnly,      /* Compute only a unique prefix of the key */
  int *piPartIdxLabel, /* OUT: Jump to this label to skip partial index */
  Index *pPrior,       /* Previously generated index key */
  int regPrior         /* Register holding previous generated key */
){
  Vdbe *v = pParse->pVdbe;
  int j;
  int regBase;
  int nCol;

  if( piPartIdxLabel ){
    if( pIdx->pPartIdxWhere ){
      *piPartIdxLabel = sqlite3VdbeMakeLabel(v);
      pParse->iSelfTab = iDataCur + 1;
      sqlite3ExprCachePush(pParse);
      sqlite3ExprIfFalseDup(pParse, pIdx->pPartIdxWhere, *piPartIdxLabel, 
                            SQLITE_JUMPIFNULL);
      pParse->iSelfTab = 0;
    }else{
      *piPartIdxLabel = 0;
    }
  }
  nCol = (prefixOnly && pIdx->uniqNotNull) ? pIdx->nKeyCol : pIdx->nColumn;
  regBase = sqlite3GetTempRange(pParse, nCol);
  if( pPrior && (regBase!=regPrior || pPrior->pPartIdxWhere) ) pPrior = 0;
  for(j=0; j<nCol; j++){
    if( pPrior
     && pPrior->aiColumn[j]==pIdx->aiColumn[j]
     && pPrior->aiColumn[j]!=XN_EXPR
    ){
      /* This column was already computed by the previous index */
      continue;
    }
    sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iDataCur, j, regBase+j);
    /* If the column affinity is REAL but the number is an integer, then it
    ** might be stored in the table as an integer (using a compact
    ** representation) then converted to REAL by an OP_RealAffinity opcode.
    ** But we are getting ready to store this value back into an index, where
    ** it should be converted by to INTEGER again.  So omit the OP_RealAffinity
    ** opcode if it is present */
    sqlite3VdbeDeletePriorOpcode(v, OP_RealAffinity);
  }
  if( regOut ){
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase, nCol, regOut);
    if( pIdx->pTable->pSelect ){
      const char *zAff = sqlite3IndexAffinityStr(pParse->db, pIdx);
      sqlite3VdbeChangeP4(v, -1, zAff, P4_TRANSIENT);
    }
  }
  sqlite3ReleaseTempRange(pParse, regBase, nCol);
  return regBase;
}